

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

charcount_t Js::JavascriptString::GetBufferLength(char16 *content)

{
  size_t sVar1;
  
  sVar1 = PAL_wcslen(content);
  if (sVar1 < 0x7fffffff) {
    return (charcount_t)sVar1;
  }
  Throw::OutOfMemory();
}

Assistant:

charcount_t
    JavascriptString::GetBufferLength(const char16 * content)
    {
        size_t cchActual = wcslen(content);

#if defined(TARGET_64)
        if (!IsValidCharCount(cchActual))
        {
            // Limit javascript string to 31-bit length
            Js::Throw::OutOfMemory();
        }
#else
        // There shouldn't be enough memory to have UINT_MAX character.
        // INT_MAX is the upper bound for 32-bit;
        Assert(IsValidCharCount(cchActual));
#endif
        return static_cast<charcount_t>(cchActual);
    }